

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_ld_preincr(DisasContext_conflict14 *ctx,TCGv_i32 r1,TCGv_i32 r2,int16_t off,MemOp mop)

{
  TCGContext_conflict9 *tcg_ctx_00;
  TCGv_i32 ret;
  TCGv_i32 temp;
  TCGContext_conflict9 *tcg_ctx;
  MemOp mop_local;
  int16_t off_local;
  TCGv_i32 r2_local;
  TCGv_i32 r1_local;
  DisasContext_conflict14 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i32(tcg_ctx_00);
  tcg_gen_addi_i32_tricore(tcg_ctx_00,ret,r2,(int)off);
  tcg_gen_qemu_ld_i32_tricore(tcg_ctx_00,r1,ret,(long)ctx->mem_idx,mop);
  tcg_gen_mov_i32(tcg_ctx_00,r2,ret);
  tcg_temp_free_i32(tcg_ctx_00,ret);
  return;
}

Assistant:

static void gen_ld_preincr(DisasContext *ctx, TCGv r1, TCGv r2, int16_t off,
                           MemOp mop)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv temp = tcg_temp_new(tcg_ctx);
    tcg_gen_addi_tl(tcg_ctx, temp, r2, off);
    tcg_gen_qemu_ld_tl(tcg_ctx, r1, temp, ctx->mem_idx, mop);
    tcg_gen_mov_tl(tcg_ctx, r2, temp);
    tcg_temp_free(tcg_ctx, temp);
}